

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darPrec.c
# Opt level: O3

uint Dar_TruthPolarize(uint uTruth,int Polarity,int nVars)

{
  ulong uVar1;
  byte bVar2;
  uint *puVar3;
  
  if (nVars < 6) {
    if (0 < nVars) {
      puVar3 = Dar_TruthPolarize::Signs;
      uVar1 = 0;
      do {
        if (((uint)Polarity >> ((uint)uVar1 & 0x1f) & 1) != 0) {
          bVar2 = (byte)(1 << ((byte)uVar1 & 0x1f));
          uTruth = (*puVar3 & uTruth) >> (bVar2 & 0x1f) | (~*puVar3 & uTruth) << (bVar2 & 0x1f);
        }
        uVar1 = uVar1 + 1;
        puVar3 = puVar3 + 1;
      } while ((uint)nVars != uVar1);
    }
    return uTruth;
  }
  __assert_fail("nVars < 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/dar/darPrec.c"
                ,0x10a,"unsigned int Dar_TruthPolarize(unsigned int, int, int)");
}

Assistant:

unsigned Dar_TruthPolarize( unsigned uTruth, int Polarity, int nVars )
{
    // elementary truth tables
    static unsigned Signs[5] = {
        0xAAAAAAAA,    // 1010 1010 1010 1010 1010 1010 1010 1010
        0xCCCCCCCC,    // 1010 1010 1010 1010 1010 1010 1010 1010
        0xF0F0F0F0,    // 1111 0000 1111 0000 1111 0000 1111 0000
        0xFF00FF00,    // 1111 1111 0000 0000 1111 1111 0000 0000
        0xFFFF0000     // 1111 1111 1111 1111 0000 0000 0000 0000
    };
    unsigned uTruthRes, uCof0, uCof1;
    int nMints, Shift, v;
    assert( nVars < 6 );
    nMints = (1 << nVars);
    uTruthRes = uTruth;
    for ( v = 0; v < nVars; v++ )
        if ( Polarity & (1 << v) )
        {
            uCof0  = uTruth & ~Signs[v];
            uCof1  = uTruth &  Signs[v];
            Shift  = (1 << v);
            uCof0 <<= Shift;
            uCof1 >>= Shift;
            uTruth = uCof0 | uCof1;
        }
    return uTruth;
}